

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O2

Amap_Obj_t * Amap_ManCreateXor(Amap_Man_t *p,Amap_Obj_t *pFan0,Amap_Obj_t *pFan1)

{
  Amap_Obj_t *pAVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  uint *puVar5;
  
  pAVar1 = Amap_ManSetupObj(p);
  *(ulong *)pAVar1 = *(ulong *)pAVar1 & 0xfffffffffffffff8 | 5;
  puVar3 = (uint *)((ulong)pFan0 & 0xfffffffffffffffe);
  pAVar1->Fan[0] = ((uint)pFan0 & 1) + (*puVar3 >> 3) * 2;
  puVar3[4] = puVar3[4] + 1;
  puVar5 = (uint *)((ulong)pFan1 & 0xfffffffffffffffe);
  pAVar1->Fan[1] = ((uint)pFan1 & 1) + (*puVar5 >> 3) * 2;
  puVar5[4] = puVar5[4] + 1;
  *(ulong *)pAVar1 =
       *(ulong *)pAVar1 & 0xdfffffffffffffff |
       (ulong)((((uint)((ulong)*(undefined8 *)puVar5 >> 0x20) ^
                (uint)((ulong)*(undefined8 *)puVar3 >> 0x20)) >> 0x1d ^ (uint)pFan0 ^ (uint)pFan1) &
              1) << 0x3d;
  uVar2 = puVar5[2];
  if ((int)puVar5[2] < (int)puVar3[2]) {
    uVar2 = puVar3[2];
  }
  uVar2 = uVar2 + 2;
  pAVar1->Level = uVar2;
  uVar4 = p->nLevelMax;
  if (p->nLevelMax < (int)uVar2) {
    p->nLevelMax = uVar2;
    uVar4 = uVar2;
  }
  if ((int)uVar4 < 0xffe) {
    p->nObjs[5] = p->nObjs[5] + 1;
    return pAVar1;
  }
  __assert_fail("p->nLevelMax < 4094",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapGraph.c"
                ,0xb0,"Amap_Obj_t *Amap_ManCreateXor(Amap_Man_t *, Amap_Obj_t *, Amap_Obj_t *)");
}

Assistant:

Amap_Obj_t * Amap_ManCreateXor( Amap_Man_t * p, Amap_Obj_t * pFan0, Amap_Obj_t * pFan1 )
{
    Amap_Obj_t * pObj;
    pObj = Amap_ManSetupObj( p );
    pObj->Type   = AMAP_OBJ_XOR;
    pObj->Fan[0] = Amap_ObjToLit(pFan0);  Amap_Regular(pFan0)->nRefs++;
    pObj->Fan[1] = Amap_ObjToLit(pFan1);  Amap_Regular(pFan1)->nRefs++;
    pObj->fPhase = Amap_ObjPhaseReal(pFan0) ^ Amap_ObjPhaseReal(pFan1);
    pObj->Level  = 2 + Abc_MaxInt( Amap_Regular(pFan0)->Level, Amap_Regular(pFan1)->Level );
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    assert( p->nLevelMax < 4094 ); // 2^12-2
    p->nObjs[AMAP_OBJ_XOR]++;
    return pObj;
}